

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Entity_State_PDU::ClearVariableParameters(Entity_State_PDU *this)

{
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  ::clear(&this->m_vVariableParameters);
  this->m_ui8NumOfVariableParams = '\0';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x90;
  return;
}

Assistant:

void Entity_State_PDU::ClearVariableParameters()
{
    m_vVariableParameters.clear();
    m_ui8NumOfVariableParams = 0;
    m_ui16PDULength = ENTITY_STATE_PDU_SIZE;
}